

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketMonitor_UNIX.cpp
# Opt level: O2

void __thiscall
FIX::SocketMonitor::block(SocketMonitor *this,Strategy *strategy,bool should_poll,double timeout)

{
  Queue *this_00;
  size_t sVar1;
  size_t sVar2;
  _func_int *p_Var3;
  undefined8 uVar4;
  long lVar5;
  pollfd timeout_00;
  Sockets *pSVar6;
  bool poll;
  bool bVar7;
  int iVar8;
  size_type sVar9;
  undefined7 in_register_00000011;
  SocketMonitor *this_01;
  uint pfds_size;
  ulong uVar10;
  pollfd *pfds;
  undefined8 uStack_60;
  pollfd local_58;
  undefined1 *local_50;
  Sockets *local_48;
  undefined4 local_3c;
  Sockets *local_38;
  
  this_00 = &this->m_dropped;
  local_58 = (pollfd)timeout;
  do {
    uStack_60 = 0x1c37cc;
    this_01 = (SocketMonitor *)this_00;
    sVar9 = std::deque<int,_std::allocator<int>_>::size(&this_00->c);
    if (sVar9 == 0) {
      local_50 = (undefined1 *)&local_58;
      local_48 = &this->m_connectSockets;
      uVar10 = (this->m_connectSockets)._M_t._M_impl.super__Rb_tree_header._M_node_count +
               (this->m_readSockets)._M_t._M_impl.super__Rb_tree_header._M_node_count +
               (this->m_writeSockets)._M_t._M_impl.super__Rb_tree_header._M_node_count;
      local_38 = &this->m_writeSockets;
      pfds_size = (uint)uVar10;
      lVar5 = -((uVar10 & 0xffffffff) * 8 + 0xf & 0xfffffffffffffff0);
      pfds = (pollfd *)((long)&local_58 + lVar5);
      *(undefined8 *)((long)&uStack_60 + lVar5) = 3;
      uVar4 = *(undefined8 *)((long)&uStack_60 + lVar5);
      *(undefined8 *)((long)&uStack_60 + lVar5) = 0x1c384d;
      buildSet(this_01,&this->m_readSockets,(pollfd *)pfds,(short)uVar4);
      sVar1 = (this->m_readSockets)._M_t._M_impl.super__Rb_tree_header._M_node_count;
      local_3c = (int)CONCAT71(in_register_00000011,should_poll);
      *(undefined8 *)((long)&uStack_60 + lVar5) = 0xc;
      pSVar6 = local_48;
      uVar4 = *(undefined8 *)((long)&uStack_60 + lVar5);
      *(undefined8 *)((long)&uStack_60 + lVar5) = 0x1c386f;
      buildSet(this_01,pSVar6,(pollfd *)(pfds + sVar1),(short)uVar4);
      sVar2 = (this->m_connectSockets)._M_t._M_impl.super__Rb_tree_header._M_node_count;
      *(undefined8 *)((long)&uStack_60 + lVar5) = 4;
      pSVar6 = local_38;
      uVar4 = *(undefined8 *)((long)&uStack_60 + lVar5);
      *(undefined8 *)((long)&uStack_60 + lVar5) = 0x1c3883;
      buildSet(this_01,pSVar6,(pollfd *)(pfds + sVar1) + sVar2,(short)uVar4);
      poll = local_3c._0_1_;
      *(undefined8 *)((long)&uStack_60 + lVar5) = 0x1c3893;
      bVar7 = sleepIfEmpty(this,poll);
      timeout_00 = local_58;
      if (!bVar7) {
        local_38 = (Sockets *)(long)(int)pfds_size;
        *(undefined8 *)((long)&uStack_60 + lVar5) = 0x1c38ae;
        iVar8 = getTimeval(this,poll,(double)timeout_00);
        pSVar6 = local_38;
        *(undefined8 *)((long)&uStack_60 + lVar5) = 0x1c38bc;
        iVar8 = ::poll(pfds,(nfds_t)pSVar6,iVar8);
        if (iVar8 != 0) {
          if (0 < iVar8) {
            *(undefined8 *)((long)&uStack_60 + lVar5) = 0x1c38d3;
            processPollList(this,strategy,(pollfd *)pfds,pfds_size);
            return;
          }
          p_Var3 = strategy->_vptr_Strategy[6];
          *(undefined8 *)((long)&uStack_60 + lVar5) = 0x1c3900;
          (*p_Var3)(strategy,this);
          return;
        }
      }
      p_Var3 = strategy->_vptr_Strategy[7];
      *(undefined8 *)((long)&uStack_60 + lVar5) = 0x1c38e1;
      (*p_Var3)(strategy,this);
      return;
    }
    uStack_60 = 0x1c37e6;
    (*strategy->_vptr_Strategy[5])
              (strategy,this,
               (ulong)(uint)*(this->m_dropped).c.super__Deque_base<int,_std::allocator<int>_>.
                             _M_impl.super__Deque_impl_data._M_start._M_cur);
    uStack_60 = 0x1c37ee;
    std::deque<int,_std::allocator<int>_>::pop_front(&this_00->c);
    uStack_60 = 0x1c37f6;
    sVar9 = std::deque<int,_std::allocator<int>_>::size(&this_00->c);
  } while (sVar9 != 0);
  return;
}

Assistant:

void SocketMonitor::block(Strategy &strategy, bool should_poll, double timeout) {
  while (m_dropped.size()) {
    strategy.onError(*this, m_dropped.front());
    m_dropped.pop();
    if (m_dropped.size() == 0) {
      return;
    }
  }

  int pfds_size = m_readSockets.size() + m_connectSockets.size() + m_writeSockets.size();
  struct pollfd pfds[pfds_size];
  buildSet(m_readSockets, pfds, POLLPRI | POLLIN);
  buildSet(m_connectSockets, pfds + m_readSockets.size(), POLLOUT | POLLERR);
  buildSet(m_writeSockets, pfds + m_readSockets.size() + m_connectSockets.size(), POLLOUT);

  if (sleepIfEmpty(should_poll)) {
    strategy.onTimeout(*this);
    return;
  }

  int result = poll(pfds, pfds_size, getTimeval(should_poll, timeout));

  if (result == 0) {
    strategy.onTimeout(*this);
    return;
  } else if (result > 0) {
    processPollList(strategy, pfds, pfds_size);
  } else {
    strategy.onError(*this);
  }
}